

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotprecv.c
# Opt level: O2

void print_usage(char *prg)

{
  fprintf(_stderr,"\nUsage: %s [options] <CAN interface>\n",prg);
  fwrite("Options:\n",9,1,_stderr);
  fwrite("         -s <can_id>   (source can_id. Use 8 digits for extended IDs)\n",0x46,1,_stderr);
  fwrite("         -d <can_id>   (destination can_id. Use 8 digits for extended IDs)\n",0x4b,1,
         _stderr);
  fwrite("         -x <addr>[:<rxaddr>]  (extended addressing / opt. separate rxaddr)\n",0x4c,1,
         _stderr);
  fwrite("         -p [tx]:[rx]  (set and enable tx/rx padding bytes)\n",0x3c,1,_stderr);
  fwrite("         -P <mode>     (check rx padding for (l)ength (c)ontent (a)ll)\n",0x47,1,_stderr);
  fwrite("         -b <bs>       (blocksize. 0 = off)\n",0x2c,1,_stderr);
  fwrite("         -m <val>      (STmin in ms/ns. See spec.)\n",0x33,1,_stderr);
  fwrite("         -f <time ns>  (force rx stmin value in nanosecs)\n",0x3a,1,_stderr);
  fwrite("         -w <num>      (max. wait frame transmissions.)\n",0x38,1,_stderr);
  fwrite("         -l            (loop: do not exit after pdu reception.)\n",0x40,1,_stderr);
  fwrite("         -F            (enable dynamic flow control parameters)\n",0x40,1,_stderr);
  fwrite("         -L <mtu>:<tx_dl>:<tx_flags>  (link layer options for CAN FD)\n",0x46,1,_stderr);
  fwrite("\nCAN IDs and addresses are given and expected in hexadecimal values.\n",0x45,1,_stderr);
  fwrite("The pdu data is written on STDOUT in space separated ASCII hex values.\n",0x47,1,_stderr);
  fputc(10,_stderr);
  return;
}

Assistant:

void print_usage(char *prg)
{
	fprintf(stderr, "\nUsage: %s [options] <CAN interface>\n", prg);
	fprintf(stderr, "Options:\n");
	fprintf(stderr, "         -s <can_id>   (source can_id. Use 8 digits for extended IDs)\n");
	fprintf(stderr, "         -d <can_id>   (destination can_id. Use 8 digits for extended IDs)\n");
	fprintf(stderr, "         -x <addr>[:<rxaddr>]  (extended addressing / opt. separate rxaddr)\n");
	fprintf(stderr, "         -p [tx]:[rx]  (set and enable tx/rx padding bytes)\n");
	fprintf(stderr, "         -P <mode>     (check rx padding for (l)ength (c)ontent (a)ll)\n");
	fprintf(stderr, "         -b <bs>       (blocksize. 0 = off)\n");
	fprintf(stderr, "         -m <val>      (STmin in ms/ns. See spec.)\n");
	fprintf(stderr, "         -f <time ns>  (force rx stmin value in nanosecs)\n");
	fprintf(stderr, "         -w <num>      (max. wait frame transmissions.)\n");
	fprintf(stderr, "         -l            (loop: do not exit after pdu reception.)\n");
	fprintf(stderr, "         -F            (enable dynamic flow control parameters)\n");
	fprintf(stderr, "         -L <mtu>:<tx_dl>:<tx_flags>  (link layer options for CAN FD)\n");
	fprintf(stderr, "\nCAN IDs and addresses are given and expected in hexadecimal values.\n");
	fprintf(stderr, "The pdu data is written on STDOUT in space separated ASCII hex values.\n");
	fprintf(stderr, "\n");
}